

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O1

void __thiscall
level_tools::register_scene_object
          (level_tools *this,char *name,string *reference,fmatrix *xform,uint32_t file_version)

{
  float fVar1;
  float fVar2;
  xr_visual_object *this_00;
  float fVar3;
  float fVar4;
  float fVar5;
  xr_visual_object *local_38;
  
  this_00 = (xr_visual_object *)operator_new(0x98);
  xray_re::xr_visual_object::xr_visual_object(this_00,this->m_scene);
  make_object_ref(this,&(this_00->super_xr_custom_object).m_name,name);
  (this_00->super_xr_custom_object).m_position.field_0.field_0.x = (xform->field_0).field_0._41;
  (this_00->super_xr_custom_object).m_position.field_0.field_0.y = (xform->field_0).field_0._42;
  (this_00->super_xr_custom_object).m_position.field_0.field_0.z = (xform->field_0).field_0._43;
  fVar3 = (xform->field_0).field_0._11;
  fVar4 = (xform->field_0).field_0._12;
  fVar5 = (xform->field_0).field_0._13;
  fVar3 = fVar5 * fVar5 + fVar3 * fVar3 + fVar4 * fVar4;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar4 = (xform->field_0).field_0._21;
  fVar5 = (xform->field_0).field_0._22;
  fVar1 = (xform->field_0).field_0._23;
  fVar4 = fVar1 * fVar1 + fVar4 * fVar4 + fVar5 * fVar5;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar5 = (xform->field_0).field_0._31;
  fVar1 = (xform->field_0).field_0._32;
  fVar2 = (xform->field_0).field_0._33;
  fVar5 = fVar2 * fVar2 + fVar5 * fVar5 + fVar1 * fVar1;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  (this_00->super_xr_custom_object).m_scale.field_0.field_0.x = fVar3;
  (this_00->super_xr_custom_object).m_scale.field_0.field_0.y = fVar4;
  (this_00->super_xr_custom_object).m_scale.field_0.field_0.z = fVar5;
  xray_re::_matrix<float>::get_hpb
            (xform,&(this_00->super_xr_custom_object).m_rotation.field_0.field_0.y,
             (float *)&(this_00->super_xr_custom_object).m_rotation,
             &(this_00->super_xr_custom_object).m_rotation.field_0.field_0.z);
  *(uint32_t *)&(this_00->super_xr_custom_object).field_0x6c = file_version;
  std::__cxx11::string::_M_assign((string *)&this_00->m_reference);
  local_38 = this_00;
  std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
  emplace_back<xray_re::xr_custom_object*>
            ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
             this->m_scene_visuals,(xr_custom_object **)&local_38);
  return;
}

Assistant:

void level_tools::register_scene_object(const char* name, const std::string& reference, const fmatrix& xform, uint32_t file_version)
{
	xr_visual_object* new_visual = new xr_visual_object(*m_scene);
	// name it just like LE does
	make_object_ref(new_visual->co_name(), name);
	new_visual->co_position().set(xform.c);
	new_visual->co_scale().set(xform.i.magnitude(),
			xform.j.magnitude(), xform.k.magnitude());
	xform.get_xyz(new_visual->co_rotation());
	new_visual->file_version() = file_version;
	new_visual->reference() = reference;
	m_scene_visuals->push_back(new_visual);
}